

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool absl::lts_20240722::debugging_internal::ParseUnqualifiedName(State *state)

{
  ParseState *pPVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  int iVar9;
  undefined4 uVar10;
  bool bVar11;
  bool bVar12;
  ComplexityGuard guard;
  char *pcVar13;
  ParseState copy;
  
  iVar2 = state->recursion_depth;
  iVar3 = state->steps;
  state->recursion_depth = iVar2 + 1;
  state->steps = iVar3 + 1;
  if (0x1ffff < iVar3 || 0xff < iVar2) {
LAB_00105f7b:
    bVar11 = false;
    goto LAB_00106149;
  }
  bVar11 = ParseOperatorName(state,(int *)0x0);
  if (!bVar11) {
    iVar2 = state->recursion_depth;
    iVar3 = state->steps;
    state->recursion_depth = iVar2 + 1;
    state->steps = iVar3 + 1;
    if (iVar3 < 0x20000 && iVar2 < 0x100) {
      uVar4 = (state->parse_state).mangled_idx;
      uVar5 = (state->parse_state).out_cur_idx;
      uVar6 = *(undefined8 *)&(state->parse_state).prev_name_idx;
      bVar11 = ParseOneCharToken(state,'C');
      if (bVar11) {
        bVar11 = ParseCharClass(state,"1234");
        if (bVar11) {
          pcVar13 = state->out;
          iVar2 = (state->parse_state).prev_name_idx;
          goto LAB_0010606a;
        }
        bVar11 = ParseOneCharToken(state,'I');
        if (((!bVar11) || (bVar11 = ParseCharClass(state,"12"), !bVar11)) ||
           (bVar11 = ParseClassEnumType(state), !bVar11)) goto LAB_00106024;
      }
      else {
LAB_00106024:
        pPVar1 = &state->parse_state;
        pPVar1->mangled_idx = uVar4;
        pPVar1->out_cur_idx = uVar5;
        *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
        bVar11 = ParseOneCharToken(state,'D');
        if ((!bVar11) || (bVar11 = ParseCharClass(state,"0124"), !bVar11)) {
          pPVar1->mangled_idx = uVar4;
          pPVar1->out_cur_idx = uVar5;
          *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
          goto LAB_00106089;
        }
        pcVar13 = state->out;
        iVar2 = (state->parse_state).prev_name_idx;
        MaybeAppend(state,"~");
LAB_0010606a:
        MaybeAppendWithLength
                  (state,pcVar13 + iVar2,(ulong)*(ushort *)&(state->parse_state).field_0xc);
      }
      state->recursion_depth = state->recursion_depth + -1;
    }
    else {
LAB_00106089:
      state->recursion_depth = state->recursion_depth + -1;
      bVar11 = ParseSourceName(state);
      if (((!bVar11) && (bVar11 = ParseLocalSourceName(state), !bVar11)) &&
         (bVar11 = ParseUnnamedTypeName(state), !bVar11)) {
        uVar7 = (state->parse_state).mangled_idx;
        uVar8 = (state->parse_state).out_cur_idx;
        uVar6 = *(undefined8 *)&(state->parse_state).prev_name_idx;
        bVar11 = ParseTwoCharToken(state,"DC");
        if ((bVar11) && (bVar11 = ParseSourceName(state), bVar11)) {
          do {
            bVar12 = ParseSourceName(state);
          } while (bVar12);
          if (bVar11) {
            bVar12 = ParseOneCharToken(state,'E');
            bVar11 = true;
            if (bVar12) goto LAB_00106149;
          }
        }
        pPVar1 = &state->parse_state;
        pPVar1->mangled_idx = uVar7;
        pPVar1->out_cur_idx = uVar8;
        *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
        bVar11 = ParseOneCharToken(state,'F');
        if (bVar11) {
          MaybeAppend(state,"friend ");
          bVar12 = ParseSourceName(state);
          bVar11 = true;
          if ((bVar12) || (bVar12 = ParseOperatorName(state,(int *)0x0), bVar12)) goto LAB_00106149;
        }
        pPVar1->mangled_idx = uVar7;
        pPVar1->out_cur_idx = uVar8;
        *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
        goto LAB_00105f7b;
      }
    }
  }
  iVar2 = state->recursion_depth;
  iVar3 = state->steps;
  state->recursion_depth = iVar2 + 1;
  state->steps = iVar3 + 1;
  if (iVar3 < 0x20000 && iVar2 < 0x100) {
    pPVar1 = &state->parse_state;
    while (bVar11 = ParseOneCharToken(state,'B'), bVar11) {
      iVar2 = pPVar1->mangled_idx;
      iVar3 = pPVar1->out_cur_idx;
      iVar9 = (state->parse_state).prev_name_idx;
      uVar10 = *(undefined4 *)&(state->parse_state).field_0xc;
      MaybeAppend(state,"[abi:");
      bVar12 = ParseSourceName(state);
      if (!bVar12) {
        pPVar1->mangled_idx = iVar2;
        pPVar1->out_cur_idx = iVar3;
        (state->parse_state).prev_name_idx = iVar9;
        *(undefined4 *)&(state->parse_state).field_0xc = uVar10;
        break;
      }
      MaybeAppend(state,"]");
    }
    bVar11 = !bVar11;
  }
  else {
    bVar11 = false;
  }
  state->recursion_depth = state->recursion_depth + -1;
LAB_00106149:
  state->recursion_depth = state->recursion_depth + -1;
  return bVar11;
}

Assistant:

static bool ParseUnqualifiedName(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  if (ParseOperatorName(state, nullptr) || ParseCtorDtorName(state) ||
      ParseSourceName(state) || ParseLocalSourceName(state) ||
      ParseUnnamedTypeName(state)) {
    return ParseAbiTags(state);
  }

  // DC <source-name>+ E
  ParseState copy = state->parse_state;
  if (ParseTwoCharToken(state, "DC") && OneOrMore(ParseSourceName, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // F <source-name>
  // F <operator-name>
  if (ParseOneCharToken(state, 'F') && MaybeAppend(state, "friend ") &&
      (ParseSourceName(state) || ParseOperatorName(state, nullptr))) {
    return true;
  }
  state->parse_state = copy;

  return false;
}